

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void malloc_mutex_assert_owner(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  witness_t *in_RSI;
  long in_RDI;
  tsd_t *tsd;
  uint8_t state;
  undefined8 local_38;
  
  if (in_RDI == 0) {
    local_38 = (witness_tsdn_t *)0x0;
  }
  else {
    local_38 = (witness_tsdn_t *)(in_RDI + 0xa40);
  }
  witness_assert_owner(local_38,in_RSI);
  return;
}

Assistant:

static inline void
malloc_mutex_assert_owner(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	witness_assert_owner(tsdn_witness_tsdp_get(tsdn), &mutex->witness);
}